

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O0

void tlx::die_with_message(string *msg)

{
  bool bVar1;
  DieException *this;
  ostream *this_00;
  string *msg_local;
  
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)&s_die_with_exception);
  if (!bVar1) {
    this_00 = std::operator<<((ostream *)&std::cerr,(string *)msg);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::terminate();
  }
  this = (DieException *)__cxa_allocate_exception(0x10);
  DieException::DieException(this,msg);
  __cxa_throw(this,&DieException::typeinfo,DieException::~DieException);
}

Assistant:

void die_with_message(const std::string& msg) {
    if (s_die_with_exception) {
        throw DieException(msg);
    }
    else {
        std::cerr << msg << std::endl;
        std::terminate();
    }
}